

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataIndex.h
# Opt level: O3

VRCORETYPE_ID __thiscall
MinVR::VRDataIndex::getType(VRDataIndex *this,string *key,string *nameSpace,bool inherit)

{
  VRCORETYPE_ID VVar1;
  pointer pcVar2;
  undefined7 in_register_00000009;
  long *local_58 [2];
  long local_48 [2];
  VRDatum_conflict *local_38;
  
  pcVar2 = (nameSpace->_M_dataplus)._M_p;
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_58,pcVar2,pcVar2 + nameSpace->_M_string_length,
             CONCAT71(in_register_00000009,inherit));
  _getDatum((VRDataIndex *)&stack0xffffffffffffffc8,(string *)this,key,SUB81(local_58,0));
  VVar1 = local_38->type;
  VRDatumPtr::~VRDatumPtr((VRDatumPtr *)&stack0xffffffffffffffc8);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  return VVar1;
}

Assistant:

VRCORETYPE_ID getType(const std::string &key,
                        const std::string nameSpace = "",
                        const bool inherit = true) const {
    return _getDatum(key, nameSpace, inherit)->getType();
  }